

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O1

double __thiscall NEST::NESTcalc::CalcElectronLET(NESTcalc *this,double E,int Z,bool CSDA)

{
  bool bVar1;
  undefined3 in_register_00000011;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double local_60;
  
  bVar1 = ValidityTests::nearlyEqual(54.0,54.0,1e-09);
  if (CONCAT31(in_register_00000011,CSDA) == 0) {
    dVar2 = log10(E);
    dVar3 = log10(E);
    dVar4 = log10(E);
    dVar4 = pow(dVar4,3.0);
    dVar5 = log10(E);
    dVar5 = pow(dVar5,4.0);
    dVar9 = log10(E);
    dVar9 = pow(dVar9,5.0);
    dVar10 = log10(E);
    dVar10 = pow(dVar10,6.0);
    dVar6 = log10(E);
    dVar6 = pow(dVar6,7.0);
    dVar7 = log10(E);
    dVar7 = pow(dVar7,8.0);
    dVar8 = log10(E);
    dVar8 = pow(dVar8,9.0);
    if (bVar1) {
      dVar2 = dVar7 * -0.011957 +
              dVar6 * 0.077169 +
              dVar10 * -0.28706 +
              dVar9 * 0.69658 +
              dVar5 * -1.1539 + dVar4 * 1.3677 + dVar3 * dVar3 * -1.2364 + dVar2 * 0.11493 + 1.4555;
      dVar8 = dVar8 * 0.00079395;
    }
    else {
      dVar2 = dVar7 * -0.0058953 +
              dVar6 * 0.030441 +
              dVar10 * -0.084659 +
              dVar9 * 0.15279 +
              dVar5 * -0.2051 +
              dVar4 * 0.25916 + dVar3 * dVar3 * -0.33151 + dVar2 * -0.45086 + 1.8106;
      dVar8 = dVar8 * 0.00045633;
    }
    dVar2 = pow(10.0,dVar8 + dVar2);
    dVar2 = (double)(-(ulong)NAN(dVar2) & 0x4059000000000000 |
                    ~-(ulong)NAN(dVar2) &
                    (-(ulong)(dVar2 <= 1.0) & 0x4059000000000000 |
                    ~-(ulong)(dVar2 <= 1.0) & (ulong)dVar2));
  }
  else {
    if (bVar1) {
      if (1.0 <= E) {
        dVar2 = log10(E);
        dVar3 = log10(E);
        dVar4 = log10(E);
        dVar4 = pow(dVar4,3.0);
        dVar5 = log10(E);
        dVar5 = pow(dVar5,4.0);
        dVar9 = log10(E);
        dVar9 = pow(dVar9,5.0);
        dVar10 = log10(E);
        dVar10 = pow(dVar10,6.0);
        local_60 = dVar10 * -0.12619 +
                   dVar9 * 0.96788 +
                   dVar5 * -3.3469 +
                   dVar4 * 2.3101 + dVar3 * dVar3 * 19.749 + dVar2 * -61.183 + 58.482;
        dVar2 = log10(E);
        dVar2 = pow(dVar2,7.0);
        dVar2 = dVar2 * 0.0065108;
      }
      else {
        if (E <= 0.0) {
          return 0.0;
        }
        if (1.0 <= E) {
          return 0.0;
        }
        dVar2 = pow(E,3.0);
        dVar3 = pow(E,4.0);
        dVar4 = pow(E,5.0);
        dVar5 = pow(E,6.0);
        local_60 = dVar5 * -28659.0 +
                   dVar4 * 44553.0 +
                   dVar3 * -36394.0 + dVar2 * 17079.0 + E * E * -4828.0 + E * 815.98 + 6.9463;
        dVar2 = pow(E,7.0);
        dVar2 = dVar2 * 7483.8;
      }
    }
    else {
      if (E < 1.0) {
        return (double)(-(ulong)(E < 1.0) & 0x4059000000000000 & -(ulong)(0.0 < E));
      }
      dVar2 = log10(E);
      dVar3 = log10(E);
      dVar4 = log10(E);
      dVar4 = pow(dVar4,3.0);
      dVar5 = log10(E);
      dVar5 = pow(dVar5,4.0);
      dVar9 = log10(E);
      dVar9 = pow(dVar9,5.0);
      local_60 = dVar9 * -0.69334 +
                 dVar5 * 6.5069 + dVar4 * -33.405 + dVar3 * dVar3 * 99.361 + dVar2 * -162.97 + 116.7
      ;
      dVar2 = log10(E);
      dVar2 = pow(dVar2,6.0);
      dVar2 = dVar2 * 0.031563;
    }
    dVar2 = dVar2 + local_60;
  }
  return dVar2;
}

Assistant:

double NESTcalc::CalcElectronLET(double E, int Z, bool CSDA) {
  double LET;

  if (!CSDA) {  // total stopping power directly from ESTAR (radiative +
                // collision)
    if (ValidityTests::nearlyEqual(ATOM_NUM,
                                   54.))  // loglog poly fit to 1-3e3keV
      LET = 1.4555 + 0.11493 * log10(E) - 1.2364 * pow(log10(E), 2.) +
            1.3677 * pow(log10(E), 3.) - 1.1539 * pow(log10(E), 4.) +
            0.69658 * pow(log10(E), 5.) - 0.28706 * pow(log10(E), 6.) +
            0.077169 * pow(log10(E), 7.) - 0.011957 * pow(log10(E), 8.) +
            0.00079395 * pow(log10(E), 9.);
    else  // ditto(ARGON)
      LET = 1.8106 - 0.45086 * log10(E) - .33151 * pow(log10(E), 2.) +
            .25916 * pow(log10(E), 3.) - 0.2051 * pow(log10(E), 4.) +
            0.15279 * pow(log10(E), 5.) - .084659 * pow(log10(E), 6.) +
            0.030441 * pow(log10(E), 7.) - .0058953 * pow(log10(E), 8.) +
            0.00045633 * pow(log10(E), 9.);
    LET = pow(10., LET);
    if (std::isnan(LET) || LET <= 1.) LET = 1e2;
    return LET;
  }

  // use a 9th-order polynomial spline to online CSDA data (still NIST's ESTAR)
  if (ValidityTests::nearlyEqual(ATOM_NUM, 54.)) {
    if (E >= 1.)
      LET = 58.482 - 61.183 * log10(E) + 19.749 * pow(log10(E), 2) +
            2.3101 * pow(log10(E), 3) - 3.3469 * pow(log10(E), 4) +
            0.96788 * pow(log10(E), 5) - 0.12619 * pow(log10(E), 6) +
            0.0065108 * pow(log10(E), 7);
    // at energies <1 keV, use a different spline, determined manually by
    // generating sub-keV electrons in Geant4 and looking at their ranges, since
    // ESTAR does not go this low (4.9.4)
    else if (E > 0. && E < 1.) {
      LET = 6.9463 + 815.98 * E - 4828 * pow(E, 2) + 17079 * pow(E, 3) -
            36394 * pow(E, 4) + 44553 * pow(E, 5) - 28659 * pow(E, 6) +
            7483.8 * pow(E, 7);
    } else {
      LET = 0.;
    }
  } else {
    // replace with Justin and Prof. Mooney's work
    if (E >= 1.)
      LET = 116.70 - 162.97 * log10(E) + 99.361 * pow(log10(E), 2) -
            33.405 * pow(log10(E), 3) + 6.5069 * pow(log10(E), 4) -
            0.69334 * pow(log10(E), 5) + .031563 * pow(log10(E), 6);
    else if (E > 0. && E < 1.) {
      LET = 100.;
    } else {
      LET = 0.;
    }
  }

  return LET;
}